

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetResponseDescriptorRPLIDAR
              (RPLIDAR *pRPLIDAR,int *pDataResponseLength,int *pSendMode,int *pDataType)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *__s;
  double dVar5;
  int local_498;
  int nbBytesDiscarded;
  int *local_490;
  uchar *ptr;
  CHRONO chrono;
  uchar recvbuf [1024];
  
  nbBytesDiscarded = 0;
  ptr = (uchar *)0x0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x400);
  local_498 = 7;
  iVar4 = 7;
  iVar2 = ReadAllRS232Port(&pRPLIDAR->RS232Port,recvbuf,7);
  iVar3 = 1;
  __s = "Error reading data from a RPLIDAR. ";
  piVar1 = pSendMode;
  if (iVar2 == 0) {
    do {
      local_490 = piVar1;
      iVar3 = FindResponseDescriptorRPLIDAR
                        (recvbuf,iVar4,pDataResponseLength,local_490,pDataType,&local_498,&ptr,
                         &nbBytesDiscarded);
      if (iVar3 == 1) {
        local_498 = 7;
        if (nbBytesDiscarded < 7) {
          local_498 = nbBytesDiscarded;
        }
      }
      else if (iVar3 == 0) {
        iVar3 = 0;
        if (iVar4 - nbBytesDiscarded < 8) {
          return 0;
        }
        __s = "Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. ";
        goto LAB_00124633;
      }
      iVar3 = local_498;
      iVar4 = iVar4 - nbBytesDiscarded;
      memmove(recvbuf,recvbuf + nbBytesDiscarded,(long)iVar4);
      if (0x3ff < iVar3 + iVar4) {
        __s = "Error reading data from a RPLIDAR : Invalid data. ";
        iVar3 = 4;
        goto LAB_00124633;
      }
      iVar3 = ReadAllRS232Port(&pRPLIDAR->RS232Port,recvbuf + iVar4,iVar3);
      if (iVar3 != 0) {
        iVar3 = 1;
        __s = "Error reading data from a RPLIDAR. ";
        goto LAB_00124633;
      }
      iVar4 = iVar4 + local_498;
      dVar5 = GetTimeElapsedChronoQuick(&chrono);
      piVar1 = local_490;
    } while (dVar5 <= 4.0);
    __s = "Error reading data from a RPLIDAR : Response descriptor timeout. ";
    iVar3 = 2;
  }
LAB_00124633:
  puts(__s);
  return iVar3;
}

Assistant:

inline int GetResponseDescriptorRPLIDAR(RPLIDAR* pRPLIDAR, int* pDataResponseLength, int* pSendMode, int* pDataType)
{
	unsigned char recvbuf[MAX_NB_BYTES_RPLIDAR];
	int BytesReceived = 0, recvbuflen = 0, res = EXIT_FAILURE, nbBytesToRequest = 0, nbBytesDiscarded = 0;
	unsigned char* ptr = NULL;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = MAX_NB_BYTES_RPLIDAR-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	// Suppose that there are not so many data to discard.
	// First try to get directly the desired response descriptor...

	nbBytesToRequest = NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR;
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf, nbBytesToRequest) != EXIT_SUCCESS)
	{
		printf("Error reading data from a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += nbBytesToRequest;
	
	for (;;)
	{
		res = FindResponseDescriptorRPLIDAR(recvbuf, BytesReceived, pDataResponseLength, pSendMode, pDataType, &nbBytesToRequest, &ptr, &nbBytesDiscarded);
		if (res == EXIT_SUCCESS) break;
		if (res == EXIT_FAILURE)
		{
			nbBytesToRequest = min(NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR, nbBytesDiscarded);
		}	
		memmove(recvbuf, recvbuf+nbBytesDiscarded, BytesReceived-nbBytesDiscarded);
		BytesReceived -= nbBytesDiscarded;
		if (BytesReceived+nbBytesToRequest > recvbuflen)
		{
			printf("Error reading data from a RPLIDAR : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadAllRS232Port(&pRPLIDAR->RS232Port, recvbuf+BytesReceived, nbBytesToRequest) != EXIT_SUCCESS)
		{
			printf("Error reading data from a RPLIDAR. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += nbBytesToRequest;
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_RPLIDAR)
		{
			printf("Error reading data from a RPLIDAR : Response descriptor timeout. \n");
			return EXIT_TIMEOUT;
		}
	}

	if (BytesReceived-nbBytesDiscarded-NB_BYTES_RESPONSE_DESCRIPTOR_RPLIDAR > 0)
	{
		printf("Warning getting data from a RPLIDAR : Unexpected data after a response descriptor. \n");
	}

	return EXIT_SUCCESS;
}